

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

void __thiscall QFileSystemModel::timerEvent(QFileSystemModel *this,QTimerEvent *event)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QFileSystemModelPrivate *files;
  qsizetype qVar5;
  const_reference pFVar6;
  QString *in_RSI;
  QFileInfoGatherer *in_RDI;
  long in_FS_OFFSET;
  QFileSystemNode *node;
  int i;
  QFileSystemModelPrivate *d;
  pointer in_stack_ffffffffffffff98;
  const_reference in_stack_ffffffffffffffa0;
  int local_3c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  files = d_func((QFileSystemModel *)0xaa479a);
  iVar3 = QTimerEvent::timerId((QTimerEvent *)0xaa47a9);
  iVar4 = QBasicTimer::timerId((QBasicTimer *)0xaa47be);
  if (iVar3 == iVar4) {
    QBasicTimer::stop();
    for (local_3c = 0; qVar5 = QList<QFileSystemModelPrivate::Fetching>::size(&files->toFetch),
        local_3c < qVar5; local_3c = local_3c + 1) {
      pFVar6 = QList<QFileSystemModelPrivate::Fetching>::at
                         ((QList<QFileSystemModelPrivate::Fetching> *)in_stack_ffffffffffffffa0,
                          (qsizetype)in_stack_ffffffffffffff98);
      bVar2 = QFileSystemModelPrivate::QFileSystemNode::hasInformation(pFVar6->node);
      if (!bVar2) {
        in_stack_ffffffffffffff98 =
             std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::operator->
                       ((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *)
                        0xaa484f);
        in_stack_ffffffffffffffa0 =
             QList<QFileSystemModelPrivate::Fetching>::at
                       ((QList<QFileSystemModelPrivate::Fetching> *)in_stack_ffffffffffffffa0,
                        (qsizetype)in_stack_ffffffffffffff98);
        QList<QFileSystemModelPrivate::Fetching>::at
                  ((QList<QFileSystemModelPrivate::Fetching> *)in_stack_ffffffffffffffa0,
                   (qsizetype)in_stack_ffffffffffffff98);
        QList<QString>::QList<QString,void>
                  ((QList<QString> *)in_stack_ffffffffffffffa0,(QString *)in_stack_ffffffffffffff98)
        ;
        QFileInfoGatherer::fetchExtendedInformation(in_RDI,in_RSI,(QStringList *)files);
        QList<QString>::~QList((QList<QString> *)0xaa48b2);
      }
    }
    QList<QFileSystemModelPrivate::Fetching>::clear
              ((QList<QFileSystemModelPrivate::Fetching> *)in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileSystemModel::timerEvent(QTimerEvent *event)
{
    Q_D(QFileSystemModel);
    if (event->timerId() == d->fetchingTimer.timerId()) {
        d->fetchingTimer.stop();
#if QT_CONFIG(filesystemwatcher)
        for (int i = 0; i < d->toFetch.size(); ++i) {
            const QFileSystemModelPrivate::QFileSystemNode *node = d->toFetch.at(i).node;
            if (!node->hasInformation()) {
                d->fileInfoGatherer->fetchExtendedInformation(d->toFetch.at(i).dir,
                                                 QStringList(d->toFetch.at(i).file));
            } else {
                // qDebug("yah!, you saved a little gerbil soul");
            }
        }
#endif
        d->toFetch.clear();
    }
}